

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Thing_Deactivate(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  AActor *thing;
  uint uVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
      uVar1 = 0;
    }
    else {
      DoDeactivateThing(it,it);
      uVar1 = 1;
    }
  }
  else {
    for (pAVar2 = AActor::TIDHash[arg0 & 0x7f];
        (thing = pAVar2, pAVar2 != (AActor *)0x0 && (pAVar2->tid != arg0)); pAVar2 = pAVar2->inext)
    {
    }
    while (thing != (AActor *)0x0) {
      for (pAVar3 = thing->inext; (pAVar3 != (AActor *)0x0 && (pAVar3->tid != arg0));
          pAVar3 = pAVar3->inext) {
      }
      DoDeactivateThing(thing,it);
      thing = pAVar3;
    }
    uVar1 = (uint)(pAVar2 != (AActor *)0x0);
  }
  return uVar1;
}

Assistant:

FUNC(LS_Thing_Deactivate)
// Thing_Deactivate (tid)
{
	if (arg0 != 0)
	{
		AActor *actor;
		FActorIterator iterator (arg0);
		int count = 0;
	
		actor = iterator.Next ();
		while (actor)
		{
			// Actor might removes itself as part of deactivation, so get next
			// one before we activate it.
			AActor *temp = iterator.Next ();
			DoDeactivateThing(actor, it);
			actor = temp;
			count++;
		}
	
		return count != 0;
	}
	else if (it != NULL)
	{
		DoDeactivateThing(it, it);
		return true;
	}
	return false;
}